

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall soul::StructuralParser::parseConnection(StructuralParser *this,Graph *graph)

{
  Allocator *pAVar1;
  SourceCodeText *pSVar2;
  Scope *pSVar3;
  char *pcVar4;
  undefined8 o;
  bool bVar5;
  SourceCodeText *oldObject;
  Expression *pEVar6;
  PoolItem *pPVar7;
  long lVar8;
  SourceCodeText *o_00;
  pool_ptr<soul::AST::Expression> *in_R9;
  pool_ref<soul::AST::Connection::SharedEndpoint> *source;
  uint64_t *args_2;
  pool_ref<soul::AST::Connection::SharedEndpoint> *dest;
  uint64_t *args_3;
  InterpolationType interpolationType;
  Context context;
  pool_ptr<soul::AST::Expression> delayLength;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> dests;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> sources;
  undefined1 local_1c0 [24];
  Ptr local_1a8;
  UTF8Reader local_1a0;
  pool_ptr<soul::AST::Expression> local_198;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> local_190;
  uint64_t *local_138;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> local_130;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_1c0._12_4_ = parseOptionalInterpolationType(this);
  local_1c0._16_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
  if ((SourceCodeText *)local_1c0._16_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_1c0._16_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_1c0._16_8_)->super_RefCountedObject).refCount + 1;
  }
  local_1a8.object = (SourceCodeText *)(this->super_SOULTokeniser).location.location.data;
  local_1a0.data = (char *)this->currentScope;
  local_130.items = (pool_ref<soul::AST::Connection::SharedEndpoint> *)local_130.space;
  local_130.numActive = 0;
  local_130.numAllocated = 8;
  local_190.items = (pool_ref<soul::AST::Connection::SharedEndpoint> *)local_190.space;
  local_190.numActive = 0;
  local_190.numAllocated = 8;
  local_198.object = (Expression *)0x0;
  do {
    pAVar1 = this->allocator;
    pEVar6 = parseExpression(this,false);
    pPVar7 = PoolAllocator::allocateSpaceForObject(&pAVar1->pool,8);
    pPVar7->item = pEVar6;
    pPVar7->destructor =
         PoolAllocator::allocate<soul::AST::Connection::SharedEndpoint,_soul::AST::Expression_&>::
         anon_class_1_0_00000001::__invoke;
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::reserve
              (&local_130,
               (size_t)((long)&(((Statement *)local_130.numActive)->super_ASTObject)._vptr_ASTObject
                       + 1));
    local_130.items[local_130.numActive] =
         (pool_ref<soul::AST::Connection::SharedEndpoint>)&pPVar7->item;
    local_130.numActive =
         (long)&(((Statement *)local_130.numActive)->super_ASTObject)._vptr_ASTObject + 1;
    bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27e596);
  } while (bVar5);
  while( true ) {
    o = local_1c0._16_8_;
    o_00 = (this->super_SOULTokeniser).location.sourceCode.object;
    if (o_00 != (SourceCodeText *)0x0) {
      (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
    }
    pSVar2 = (SourceCodeText *)(this->super_SOULTokeniser).location.location.data;
    pSVar3 = this->currentScope;
    if (o_00 != (SourceCodeText *)local_1c0._16_8_) {
      local_1c0._16_8_ = o_00;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)o);
      o_00 = (SourceCodeText *)0x0;
    }
    local_1a8.object = pSVar2;
    local_1a0.data = (char *)pSVar3;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o_00);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27e77e);
    parseDelayLength((StructuralParser *)local_1c0);
    local_198.object = (Expression *)local_1c0._0_8_;
    do {
      pAVar1 = this->allocator;
      pEVar6 = parseConnectionPoint(this);
      pPVar7 = PoolAllocator::allocateSpaceForObject(&pAVar1->pool,8);
      pPVar7->item = pEVar6;
      pPVar7->destructor =
           PoolAllocator::allocate<soul::AST::Connection::SharedEndpoint,_soul::AST::Expression_&>::
           anon_class_1_0_00000001::__invoke;
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::reserve
                (&local_190,local_190.numActive + 1);
      local_190.items[local_190.numActive] =
           (pool_ref<soul::AST::Connection::SharedEndpoint>)&pPVar7->item;
      local_190.numActive = local_190.numActive + 1;
      bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27e596);
    } while (bVar5);
    if (((NoopStatement *)0x1 < local_130.numActive) && (1 < local_190.numActive)) {
      CompileMessageHelpers::createMessage<char_const(&)[53]>
                (&local_68,(CompileMessageHelpers *)0x1,none,0x27e09f,
                 "Many-to-many connections are not currently supported",(char (*) [53])in_R9);
      AST::Context::throwError((Context *)(local_1c0 + 0x10),&local_68,false);
    }
    if ((NoopStatement *)local_130.numActive != (NoopStatement *)0x0) {
      local_138 = (uint64_t *)(local_130.items + local_130.numActive);
      args_2 = (uint64_t *)local_130.items;
      do {
        if ((double)local_190.numActive != 0.0) {
          lVar8 = local_190.numActive << 3;
          args_3 = (uint64_t *)local_190.items;
          do {
            in_R9 = &local_198;
            local_1c0._0_8_ =
                 PoolAllocator::
                 allocate<soul::AST::Connection,soul::AST::Context&,soul::InterpolationType&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ptr<soul::AST::Expression>&>
                           (&this->allocator->pool,(Context *)(local_1c0 + 0x10),
                            (InterpolationType *)(local_1c0 + 0xc),
                            (pool_ref<soul::AST::Connection::SharedEndpoint> *)args_2,
                            (pool_ref<soul::AST::Connection::SharedEndpoint> *)args_3,&local_198);
            std::
            vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
            ::emplace_back<soul::pool_ref<soul::AST::Connection>>
                      ((vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
                        *)&graph->connections,(pool_ref<soul::AST::Connection> *)local_1c0);
            args_3 = args_3 + 1;
            lVar8 = lVar8 + -8;
          } while (lVar8 != 0);
        }
        args_2 = args_2 + 1;
      } while (args_2 != local_138);
    }
    pcVar4 = (this->super_SOULTokeniser).currentType.text;
    if ((pcVar4 != "->") &&
       ((((pcVar4 == (char *)0x0 || (*pcVar4 != '-')) || (pcVar4[1] != '>')) || (pcVar4[2] != '\0'))
       )) break;
    if ((double)local_190.numActive != 4.94065645841247e-324) {
      if ((double)local_190.numActive == 0.0) {
        throwInternalCompilerError("! empty()","back",0xa9);
      }
      lVar8 = **(long **)(local_190.items + (local_190.numActive - 1));
      CompileMessageHelpers::createMessage<>
                (&local_a0,syntax,error,
                 "Cannot create a chained sequence of connections when multiple endpoints are specified"
                );
      AST::Context::throwError((Context *)(lVar8 + 0x10),&local_a0,false);
    }
    if (**(long **)local_190.items != 0) {
      lVar8 = __dynamic_cast(**(long **)local_190.items,&AST::Expression::typeinfo,
                             &AST::DotOperator::typeinfo,0);
      if (lVar8 != 0) {
        lVar8 = *(long *)(lVar8 + 0x38);
        CompileMessageHelpers::createMessage<>
                  (&local_d8,syntax,error,
                   "A processor that is chained between two others cannot specify an endpoint name")
        ;
        AST::Context::throwError((Context *)(lVar8 + 0x10),&local_d8,false);
      }
    }
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::operator=
              (&local_130,&local_190);
    local_190.numActive = 0;
    if ((pointer)0x8 < local_190.numAllocated) {
      if (local_190.items != (pool_ref<soul::AST::Connection::SharedEndpoint> *)0x0) {
        operator_delete__(local_190.items);
      }
      local_190.items = (pool_ref<soul::AST::Connection::SharedEndpoint> *)local_190.space;
      local_190.numAllocated = 8;
    }
  }
  local_190.numActive = 0;
  if (((pointer)0x8 < local_190.numAllocated) &&
     (local_190.items != (pool_ref<soul::AST::Connection::SharedEndpoint> *)0x0)) {
    operator_delete__(local_190.items);
  }
  local_130.numActive = 0;
  if ((8 < local_130.numAllocated) &&
     (local_130.items != (pool_ref<soul::AST::Connection::SharedEndpoint> *)0x0)) {
    operator_delete__(local_130.items);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_1c0._16_8_);
  return;
}

Assistant:

void parseConnection (AST::Graph& graph)
    {
        auto interpolationType = parseOptionalInterpolationType();
        auto context = getContext();
        ArrayWithPreallocation<pool_ref<AST::Connection::SharedEndpoint>, 8> sources, dests;
        pool_ptr<AST::Expression> delayLength;

        for (;;)
        {
            sources.push_back (allocator.allocate<AST::Connection::SharedEndpoint> (parseExpression()));

            if (! matchIf (Operator::comma))
                break;
        }

        for (;;)
        {
            context = getContext();
            expect (Operator::rightArrow);
            delayLength = parseDelayLength();

            for (;;)
            {
                dests.push_back (allocator.allocate<AST::Connection::SharedEndpoint> (parseConnectionPoint()));

                if (! matchIf (Operator::comma))
                    break;
            }

            if (sources.size() > 1 && dests.size() > 1)
                context.throwError (Errors::notYetImplemented ("Many-to-many connections are not currently supported"));

            for (auto& source : sources)
                for (auto& dest : dests)
                    graph.connections.push_back (allocate<AST::Connection> (context, interpolationType, source, dest, delayLength));

            if (matches (Operator::rightArrow))
            {
                if (dests.size() != 1)
                    dests.back()->endpoint->context.throwError (Errors::cannotChainConnectionWithMultiple());

                if (auto dot = cast<AST::DotOperator> (dests.back()->endpoint))
                    dot->rhs.context.throwError (Errors::cannotNameEndpointInChain());

                sources = dests;
                dests.clear();
                continue;
            }

            break;
        }
    }